

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O1

void __thiscall blc::tools::pipe::waitWrite(pipe *this,int usec)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  timespec local_38;
  
  iVar3 = (*(this->super_stream)._vptr_stream[6])();
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(this->super_stream)._vptr_stream[5])(this), (char)iVar3 == '\0')) {
    do {
      uVar1 = (ulong)(long)usec / 1000000;
      lVar2 = ((ulong)(long)usec % 1000000) * 1000;
      if (0 < usec) {
        do {
          local_38.tv_nsec = lVar2;
          local_38.tv_sec = uVar1;
          iVar3 = nanosleep(&local_38,&local_38);
          if (iVar3 != -1) break;
          piVar4 = __errno_location();
          uVar1 = local_38.tv_sec;
          lVar2 = local_38.tv_nsec;
        } while (*piVar4 == 4);
      }
      iVar3 = (*(this->super_stream)._vptr_stream[5])(this);
    } while ((char)iVar3 == '\0');
  }
  return;
}

Assistant:

void blc::tools::pipe::waitWrite(int usec) const {
	if (this->isClosed())
		return;
	while (this->writable() == false) {
		std::this_thread::sleep_for(std::chrono::microseconds(usec));
	}
}